

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

void __thiscall
acto::actor::mem_handler_t<msg_start,_Wall,_const_msg_start_&>::mem_handler_t
          (mem_handler_t<msg_start,_Wall,_const_msg_start_&> *this,F *func,Wall *ptr)

{
  (this->super_handler_t)._vptr_handler_t = (_func_int **)&PTR__mem_handler_t_0010fab8;
  std::function<void_(Wall_*,_acto::actor_ref,_const_msg_start_&)>::function(&this->func_,func);
  this->ptr_ = ptr;
  if ((this->func_).super__Function_base._M_manager == (_Manager_type)0x0) {
    __assert_fail("func_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/include/acto/acto.h"
                  ,0x14f,
                  "acto::actor::mem_handler_t<msg_start, Wall, const msg_start &>::mem_handler_t(F &&, C *) [M = msg_start, C = Wall, P = const msg_start &]"
                 );
  }
  if (ptr != (Wall *)0x0) {
    return;
  }
  __assert_fail("ptr_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/include/acto/acto.h"
                ,0x150,
                "acto::actor::mem_handler_t<msg_start, Wall, const msg_start &>::mem_handler_t(F &&, C *) [M = msg_start, C = Wall, P = const msg_start &]"
               );
}

Assistant:

mem_handler_t(F&& func, C* ptr) noexcept
      : func_(std::move(func))
      , ptr_(ptr) {
      assert(func_);
      assert(ptr_);
    }